

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O2

void __thiscall duckdb::WindowTokenTree::CleanupSort(WindowTokenTree *this)

{
  GlobalSortStatePtr *pGVar1;
  byte bVar2;
  ClientContext *pCVar3;
  byte *pbVar4;
  pointer this_00;
  Elements *this_01;
  type pGVar5;
  pointer pGVar6;
  reference pvVar7;
  reference pvVar8;
  pointer this_02;
  Elements *this_03;
  reference pvVar9;
  value_type vVar10;
  value_type vVar11;
  data_ptr_t pdVar12;
  uchar *d;
  byte *pbVar13;
  ulong uVar14;
  PayloadScanner scanner;
  DataChunk local_78;
  WindowTokenTree *local_38;
  
  local_38 = this;
  if ((this->super_WindowMergeSortTree).mst64.
      super_unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *)0x0) {
    this_02 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
              ::operator->(&(this->super_WindowMergeSortTree).mst32);
    this_03 = MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::
              LowestLevel(this_02);
    pGVar1 = &(this->super_WindowMergeSortTree).global_sort;
    pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator*(pGVar1);
    PayloadScanner::PayloadScanner(&scanner,pGVar5,true);
    DataChunk::DataChunk(&local_78);
    pCVar3 = (this->super_WindowMergeSortTree).context;
    pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator->(pGVar1);
    DataChunk::Initialize(&local_78,pCVar3,&(pGVar6->payload_layout).types,0x800);
    pbVar4 = (this->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar12 = (data_ptr_t)0x0;
    uVar14 = 0;
    vVar10 = 0;
    for (pbVar13 = (this->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start; pbVar13 != pbVar4; pbVar13 = pbVar13 + 1) {
      if (local_78.count <= uVar14) {
        DataChunk::Reset(&local_78);
        PayloadScanner::Scan(&scanner,&local_78);
        if (local_78.count == 0) break;
        pvVar7 = vector<duckdb::Vector,_true>::get<true>(&local_78.data,0);
        pdVar12 = pvVar7->data;
        uVar14 = 0;
      }
      bVar2 = *pbVar13;
      pvVar9 = vector<unsigned_int,_true>::get<true>(this_03,(ulong)*(uint *)(pdVar12 + uVar14 * 4))
      ;
      uVar14 = uVar14 + 1;
      vVar10 = vVar10 + bVar2;
      *pvVar9 = vVar10;
    }
  }
  else {
    this_00 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
              ::operator->(&(this->super_WindowMergeSortTree).mst64);
    this_01 = MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::
              LowestLevel(this_00);
    pGVar1 = &(this->super_WindowMergeSortTree).global_sort;
    pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator*(pGVar1);
    PayloadScanner::PayloadScanner(&scanner,pGVar5,true);
    DataChunk::DataChunk(&local_78);
    pCVar3 = (this->super_WindowMergeSortTree).context;
    pGVar6 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator->(pGVar1);
    DataChunk::Initialize(&local_78,pCVar3,&(pGVar6->payload_layout).types,0x800);
    pbVar4 = (this->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar12 = (data_ptr_t)0x0;
    uVar14 = 0;
    vVar11 = 0;
    for (pbVar13 = (this->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start; pbVar13 != pbVar4; pbVar13 = pbVar13 + 1) {
      if (local_78.count <= uVar14) {
        DataChunk::Reset(&local_78);
        PayloadScanner::Scan(&scanner,&local_78);
        if (local_78.count == 0) break;
        pvVar7 = vector<duckdb::Vector,_true>::get<true>(&local_78.data,0);
        pdVar12 = pvVar7->data;
        uVar14 = 0;
      }
      bVar2 = *pbVar13;
      pvVar8 = vector<unsigned_long,_true>::get<true>(this_01,*(size_type *)(pdVar12 + uVar14 * 8));
      vVar11 = vVar11 + bVar2;
      uVar14 = uVar14 + 1;
      *pvVar8 = vVar11;
    }
  }
  DataChunk::~DataChunk(&local_78);
  PayloadScanner::~PayloadScanner(&scanner);
  local_78.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(local_38->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_78.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(local_38->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_78.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(local_38->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
  (local_38->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (local_38->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (local_38->deltas).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  WindowMergeSortTree::CleanupSort(&local_38->super_WindowMergeSortTree);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78);
  return;
}

Assistant:

void WindowTokenTree::CleanupSort() {
	//	Convert the deltas to tokens
	if (mst64) {
		BuildTokens(*this, mst64->LowestLevel());
	} else {
		BuildTokens(*this, mst32->LowestLevel());
	}

	// Deallocate memory
	vector<uint8_t> empty;
	deltas.swap(empty);

	WindowMergeSortTree::CleanupSort();
}